

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

int32_t __thiscall fasttext::Model::getNegative(Model *this,int32_t target)

{
  int iVar1;
  pointer piVar2;
  ulong uVar3;
  
  piVar2 = (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = this->negpos;
  do {
    iVar1 = piVar2[uVar3];
    uVar3 = (uVar3 + 1) %
            (ulong)((long)(this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
  } while (iVar1 == target);
  this->negpos = uVar3;
  return iVar1;
}

Assistant:

int32_t Model::getNegative(int32_t target) {
	int32_t negative;
	do {
		negative = negatives_[negpos];
		negpos = (negpos + 1) % negatives_.size();
	} while (target == negative);
	return negative;
}